

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.cc
# Opt level: O0

bool __thiscall
sptk::GaussianMixtureModeling::Run
          (GaussianMixtureModeling *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *input_vectors,vector<double,_std::allocator<double>_> *weights,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *mean_vectors,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices
          ,double *total_log_likelihood)

{
  bool bVar1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *mean_vectors_00;
  long lVar2;
  vector<double,_std::allocator<double>_> *input_vector;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  double *pdVar7;
  const_reference pvVar8;
  ostream *poVar9;
  void *this_00;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RSI;
  double *in_RDI;
  Buffer *in_R8;
  double *in_R9;
  double dVar10;
  double dVar11;
  double dVar12;
  double change;
  double c;
  double b;
  double a;
  double mu_m;
  double mu_l;
  int m_2;
  int l_5;
  double z_5;
  double *mu_3;
  int k_9;
  int m_1;
  int l_4;
  double z_4;
  double *mu_2;
  int k_8;
  int l_3;
  double z_3;
  double *mu_1;
  int k_7;
  int l_2;
  double z_2;
  double *mu;
  int k_6;
  int k_5;
  double z_1;
  int k_4;
  double z;
  int m;
  int l_1;
  int l;
  double posterior;
  int k_3;
  double *x;
  double denominator;
  int t;
  int num_data;
  double log_likelihood;
  int k_2;
  int n;
  double prev_log_likelihood;
  vector<double,_std::allocator<double>_> numerators;
  Buffer buffer;
  int k_1;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> buffer2;
  int k;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  buffer1;
  vector<double,_std::allocator<double>_> buffer0;
  int length;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffa98;
  Buffer *in_stack_fffffffffffffaa0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffaa8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffab0;
  size_type in_stack_fffffffffffffab8;
  int in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  ostream *in_stack_fffffffffffffad8;
  GaussianMixtureModeling *in_stack_fffffffffffffae0;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *in_stack_fffffffffffffb18;
  GaussianMixtureModeling *in_stack_fffffffffffffb20;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb38;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb40;
  int local_474;
  int local_43c;
  int local_3dc;
  vector<double,_std::allocator<double>_> *weights_00;
  undefined1 *puVar13;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices_00;
  undefined4 in_stack_fffffffffffffca0;
  int iVar14;
  undefined4 in_stack_fffffffffffffcb0;
  _Setw in_stack_fffffffffffffcb4;
  Row local_340;
  double local_328;
  Row local_320;
  double local_308;
  Row local_300;
  double local_2e8;
  double local_2e0;
  double local_2d8;
  Row local_2d0;
  int local_2b8;
  int local_2b4;
  double local_2b0;
  reference local_2a8;
  int local_29c;
  Row local_298;
  Row local_280;
  Row local_268;
  int local_250;
  int local_24c;
  double local_248;
  reference local_240;
  int local_238;
  int local_234;
  double local_230;
  reference local_228;
  int local_220;
  int local_21c;
  double local_218;
  reference local_210;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  int iVar15;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffe10;
  GaussianMixtureModeling *in_stack_fffffffffffffe18;
  Row local_1d0;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  double local_1a8;
  int local_19c;
  const_reference local_198;
  undefined4 local_18c;
  SymmetricMatrix local_188;
  double *local_148;
  double *local_140;
  int local_134;
  pointer local_130;
  vector<double,_std::allocator<double>_> local_121 [4];
  undefined1 local_b8;
  int local_b0;
  undefined1 local_a9;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> local_a8;
  int local_90;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_88;
  undefined1 local_59 [29];
  int local_3c;
  double *local_38;
  Buffer *local_30;
  vector<double,_std::allocator<double>_> *local_28;
  vector<double,_std::allocator<double>_> *local_20;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_18;
  byte local_1;
  
  if ((((((*(byte *)((long)in_RDI + 0xa9) & 1) == 0) ||
        (local_38 = in_R9, local_30 = in_R8, local_28 = in_RCX, local_20 = in_RDX, local_18 = in_RSI
        , bVar1 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::empty((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)in_stack_fffffffffffffab0._M_current), bVar1)) ||
       (local_20 == (vector<double,_std::allocator<double>_> *)0x0)) ||
      ((local_28 == (vector<double,_std::allocator<double>_> *)0x0 || (local_30 == (Buffer *)0x0))))
     || (local_38 == (double *)0x0)) {
    local_1 = 0;
  }
  else {
    local_3c = *(int *)(in_RDI + 1) + 1;
    iVar14 = *(int *)(in_RDI + 10);
    if (iVar14 == 0) {
      bVar1 = anon_unknown.dwarf_f3a8::CheckGmm
                        (in_stack_fffffffffffffac0,(int)(in_stack_fffffffffffffab8 >> 0x20),
                         (vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffffab0._M_current,
                         (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)in_stack_fffffffffffffaa8._M_current,
                         (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                         in_stack_fffffffffffffaa0);
      if (!bVar1) {
        local_1 = 0;
        goto LAB_0010a892;
      }
    }
    else if (iVar14 == 1) {
      bVar1 = Initialize(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                         in_stack_fffffffffffffe00,
                         (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      if (!bVar1) {
        local_1 = 0;
        goto LAB_0010a892;
      }
    }
    else {
      if (iVar14 != 2) {
        local_1 = 0;
        goto LAB_0010a892;
      }
      std::vector<double,_std::allocator<double>_>::operator=
                (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)in_stack_fffffffffffffb40,
                  (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)in_stack_fffffffffffffb38);
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator=
                ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                 in_stack_fffffffffffffb40,
                 (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                 in_stack_fffffffffffffb38);
    }
    mean_vectors_00 =
         (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *)(long)*(int *)((long)in_RDI + 0xc);
    covariance_matrices_00 =
         (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)local_59;
    std::allocator<double>::allocator((allocator<double> *)0x108e60);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
               in_stack_fffffffffffffab8,(allocator_type *)in_stack_fffffffffffffab0._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x108e8c);
    lVar2 = (long)*(int *)((long)in_RDI + 0xc);
    std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
              ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x108eb5);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
             in_stack_fffffffffffffab8,(allocator_type *)in_stack_fffffffffffffab0._M_current);
    std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
              ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x108ee1);
    for (local_90 = 0; local_90 < *(int *)((long)in_RDI + 0xc); local_90 = local_90 + 1) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](&local_88,(long)local_90);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                 in_stack_fffffffffffffab8);
    }
    input_vector = (vector<double,_std::allocator<double>_> *)(long)*(int *)((long)in_RDI + 0xc);
    puVar13 = &local_a9;
    std::allocator<sptk::SymmetricMatrix>::allocator((allocator<sptk::SymmetricMatrix> *)0x108fce);
    std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
              ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
               CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
               in_stack_fffffffffffffab8,(allocator_type *)in_stack_fffffffffffffab0._M_current);
    std::allocator<sptk::SymmetricMatrix>::~allocator((allocator<sptk::SymmetricMatrix> *)0x108ffa);
    for (local_b0 = 0; local_b0 < *(int *)((long)in_RDI + 0xc); local_b0 = local_b0 + 1) {
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                (&local_a8,(long)local_b0);
      SymmetricMatrix::Resize
                ((SymmetricMatrix *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                 (int)(in_stack_fffffffffffffab8 >> 0x20));
    }
    Buffer::Buffer(in_stack_fffffffffffffaa0);
    weights_00 = local_121;
    std::allocator<double>::allocator((allocator<double> *)0x1090cb);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
               in_stack_fffffffffffffab8,(allocator_type *)in_stack_fffffffffffffab0._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x1090f7);
    local_130 = (pointer)0xffefffffffffffff;
    for (local_134 = 1; local_134 <= *(int *)(in_RDI + 2); local_134 = local_134 + 1) {
      local_140 = (double *)
                  std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffa98);
      local_148 = (double *)
                  std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffa98);
      local_188.index_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
                 (double *)in_stack_fffffffffffffaa0);
      for (local_188.index_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
           super__Vector_impl_data._M_finish._4_4_ = 0;
          local_188.index_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ < *(int *)((long)in_RDI + 0xc);
          local_188.index_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ =
               local_188.index_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
               super__Vector_impl_data._M_finish._4_4_ + 1) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[](&local_88,
                     (long)local_188.index_.super__Vector_base<double_*,_std::allocator<double_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish._4_4_);
        local_188.index_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffa98)
        ;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[](&local_88,
                     (long)local_188.index_.super__Vector_base<double_*,_std::allocator<double_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish._4_4_);
        local_188.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffa98);
        local_188.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::
        fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                  (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
                   (double *)in_stack_fffffffffffffaa0);
        std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                  (&local_a8,
                   (long)local_188.index_.super__Vector_base<double_*,_std::allocator<double_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish._4_4_);
        SymmetricMatrix::Fill
                  ((SymmetricMatrix *)in_stack_fffffffffffffab0._M_current,
                   (double)in_stack_fffffffffffffaa8._M_current);
      }
      local_b8 = 0;
      local_188.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      sVar3 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(local_18);
      local_188._12_4_ = SUB84(sVar3,0);
      for (local_188.num_dimension_ = 0; local_188.num_dimension_ < (int)local_188._12_4_;
          local_188.num_dimension_ = local_188.num_dimension_ + 1) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[](local_18,(long)local_188.num_dimension_);
        in_stack_fffffffffffffab0._M_current = (double *)&local_188;
        in_stack_fffffffffffffaa8._M_current =
             (double *)
             ((long)&local_121[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + 1);
        in_stack_fffffffffffffa98 = local_28;
        in_stack_fffffffffffffaa0 = local_30;
        bVar1 = CalculateLogProbability
                          ((int)lVar2,(int)((ulong)puVar13 >> 0x20),SUB81((ulong)puVar13 >> 0x18,0),
                           SUB81((ulong)puVar13 >> 0x10,0),input_vector,weights_00,mean_vectors_00,
                           covariance_matrices_00,
                           (vector<double,_std::allocator<double>_> *)
                           CONCAT44(iVar14,in_stack_fffffffffffffca0),in_RDI,
                           (Buffer *)
                           CONCAT44(in_stack_fffffffffffffcb4._M_n,in_stack_fffffffffffffcb0));
        if (!bVar1) {
          local_1 = 0;
          goto LAB_0010a80c;
        }
        local_188.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((double)local_188._vptr_SymmetricMatrix +
                      (double)local_188.data_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](local_18,(long)local_188.num_dimension_);
        local_198 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0);
        for (local_19c = 0; local_19c < *(int *)((long)in_RDI + 0xc); local_19c = local_19c + 1) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              ((long)&local_121[0].
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start + 1),(long)local_19c);
          dVar10 = exp(*pvVar5 - (double)local_188._vptr_SymmetricMatrix);
          local_1a8 = dVar10;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_59 + 1),
                              (long)local_19c);
          *pvVar5 = dVar10 + *pvVar5;
          for (local_1ac = 0; dVar10 = local_1a8, local_1ac <= *(int *)(in_RDI + 1);
              local_1ac = local_1ac + 1) {
            dVar11 = local_198[local_1ac];
            pvVar6 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](&local_88,(long)local_19c);
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar6,(long)local_1ac);
            *pvVar5 = dVar10 * dVar11 + *pvVar5;
          }
          for (local_1b0 = 0; local_1b0 <= *(int *)(in_RDI + 1); local_1b0 = local_1b0 + 1) {
            if (((ulong)in_RDI[0x15] & 1) == 0) {
              local_3dc = 0;
            }
            else {
              local_3dc = local_1b0;
            }
            for (local_1b4 = local_3dc; local_1b4 <= local_1b0; local_1b4 = local_1b4 + 1) {
              SymmetricMatrix::operator[]
                        ((SymmetricMatrix *)in_stack_fffffffffffffaa8._M_current,
                         (int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
              pdVar7 = SymmetricMatrix::Row::operator[]
                                 ((Row *)in_stack_fffffffffffffaa0,
                                  (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
              dVar10 = *pdVar7;
              SymmetricMatrix::Row::~Row(&local_1d0);
              if ((dVar10 != 0.0) || (NAN(dVar10))) {
                dVar11 = local_1a8 * local_198[local_1b0];
                dVar10 = local_198[local_1b4];
                std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::
                operator[](&local_a8,(long)local_19c);
                SymmetricMatrix::operator[]
                          ((SymmetricMatrix *)in_stack_fffffffffffffaa8._M_current,
                           (int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
                pdVar7 = SymmetricMatrix::Row::operator[]
                                   ((Row *)in_stack_fffffffffffffaa0,
                                    (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
                *pdVar7 = dVar11 * dVar10 + *pdVar7;
                SymmetricMatrix::Row::~Row((Row *)&stack0xfffffffffffffe18);
              }
            }
          }
        }
      }
      if ((in_RDI[0xb] != 0.0) || (NAN(in_RDI[0xb]))) {
        dVar10 = 1.0 / ((double)(int)local_188._12_4_ + in_RDI[0xb]);
        for (iVar15 = 0; iVar15 < *(int *)((long)in_RDI + 0xc); iVar15 = iVar15 + 1) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_59 + 1),(long)iVar15
                             );
          dVar11 = *pvVar5;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e),
                              (long)iVar15);
          dVar11 = (dVar11 + *pvVar8) * dVar10;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)iVar15);
          *pvVar5 = dVar11;
        }
      }
      else {
        dVar10 = 1.0 / (double)(int)local_188._12_4_;
        for (iVar15 = 0; iVar15 < *(int *)((long)in_RDI + 0xc); iVar15 = iVar15 + 1) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_59 + 1),(long)iVar15
                             );
          dVar11 = *pvVar5 * dVar10;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)iVar15);
          *pvVar5 = dVar11;
        }
      }
      FloorWeight(in_stack_fffffffffffffae0,
                  (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffad8);
      if ((in_RDI[0xb] != 0.0) || (NAN(in_RDI[0xb]))) {
        for (local_220 = 0; local_220 < *(int *)((long)in_RDI + 0xc); local_220 = local_220 + 1) {
          pvVar6 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)local_28,(long)local_220);
          local_228 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,0);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_59 + 1),
                              (long)local_220);
          dVar10 = *pvVar5;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e),
                              (long)local_220);
          local_230 = 1.0 / (dVar10 + *pvVar8);
          for (local_234 = 0; local_234 <= *(int *)(in_RDI + 1); local_234 = local_234 + 1) {
            pvVar6 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](&local_88,(long)local_220);
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar6,(long)local_234);
            dVar10 = *pvVar5;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e),
                                (long)local_220);
            dVar11 = *pvVar8;
            pvVar4 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   *)(in_RDI + 0xf),(long)local_220);
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar4,(long)local_234);
            local_228[local_234] = (dVar11 * *pvVar8 + dVar10) * local_230;
          }
        }
      }
      else {
        for (iVar15 = 0; iVar15 < *(int *)((long)in_RDI + 0xc); iVar15 = iVar15 + 1) {
          pvVar6 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)local_28,(long)iVar15);
          local_210 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,0);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_59 + 1),(long)iVar15
                             );
          local_218 = 1.0 / *pvVar5;
          for (local_21c = 0; local_21c <= *(int *)(in_RDI + 1); local_21c = local_21c + 1) {
            pvVar6 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](&local_88,(long)iVar15);
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar6,(long)local_21c);
            local_210[local_21c] = *pvVar5 * local_218;
          }
        }
      }
      if ((in_RDI[0xb] != 0.0) || (NAN(in_RDI[0xb]))) {
        for (local_29c = 0; local_29c < *(int *)((long)in_RDI + 0xc); local_29c = local_29c + 1) {
          pvVar6 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)local_28,(long)local_29c);
          local_2a8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,0);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_59 + 1),
                              (long)local_29c);
          dVar10 = *pvVar5;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e),
                              (long)local_29c);
          local_2b0 = 1.0 / (dVar10 + *pvVar8);
          for (local_2b4 = 0; local_2b4 <= *(int *)(in_RDI + 1); local_2b4 = local_2b4 + 1) {
            if (((ulong)in_RDI[0x15] & 1) == 0) {
              local_474 = 0;
            }
            else {
              local_474 = local_2b4;
            }
            for (local_2b8 = local_474; local_2b8 <= local_2b4; local_2b8 = local_2b8 + 1) {
              SymmetricMatrix::operator[]
                        ((SymmetricMatrix *)in_stack_fffffffffffffaa8._M_current,
                         (int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
              pdVar7 = SymmetricMatrix::Row::operator[]
                                 ((Row *)in_stack_fffffffffffffaa0,
                                  (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
              dVar10 = *pdVar7;
              SymmetricMatrix::Row::~Row(&local_2d0);
              if ((dVar10 != 0.0) || (NAN(dVar10))) {
                pvVar6 = std::
                         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ::operator[](&local_88,(long)local_29c);
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (pvVar6,(long)local_2b4);
                dVar10 = *pvVar5;
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(local_59 + 1),
                                    (long)local_29c);
                local_2d8 = dVar10 / *pvVar5;
                pvVar6 = std::
                         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ::operator[](&local_88,(long)local_29c);
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (pvVar6,(long)local_2b8);
                dVar10 = *pvVar5;
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(local_59 + 1),
                                    (long)local_29c);
                local_2e0 = dVar10 / *pvVar5;
                std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::
                operator[](&local_a8,(long)local_29c);
                SymmetricMatrix::operator[]
                          ((SymmetricMatrix *)in_stack_fffffffffffffaa8._M_current,
                           (int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
                pdVar7 = SymmetricMatrix::Row::operator[]
                                   ((Row *)in_stack_fffffffffffffaa0,
                                    (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
                dVar10 = *pdVar7;
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(local_59 + 1),
                                    (long)local_29c);
                dVar10 = dVar10 - *pvVar5 * ((local_2d8 * local_2a8[local_2b8] +
                                             local_2a8[local_2b4] * local_2e0) -
                                            local_2a8[local_2b4] * local_2a8[local_2b8]);
                SymmetricMatrix::Row::~Row(&local_300);
                local_2e8 = dVar10;
                pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e),
                                    (long)local_29c);
                dVar10 = *pvVar8;
                std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::
                operator[]((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                           (in_RDI + 0x12),(long)local_29c);
                SymmetricMatrix::operator[]
                          ((SymmetricMatrix *)in_stack_fffffffffffffaa8._M_current,
                           (int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
                pdVar7 = SymmetricMatrix::Row::operator[]
                                   ((Row *)in_stack_fffffffffffffaa0,
                                    (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
                dVar11 = *pdVar7;
                SymmetricMatrix::Row::~Row(&local_320);
                local_308 = dVar10 * dVar11;
                pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e),
                                    (long)local_29c);
                dVar10 = *pvVar8;
                in_stack_fffffffffffffb18 =
                     (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                     (in_RDI + 0xf);
                pvVar4 = std::
                         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       *)in_stack_fffffffffffffb18,(long)local_29c);
                pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (pvVar4,(long)local_2b4);
                in_stack_fffffffffffffb20 =
                     (GaussianMixtureModeling *)(dVar10 * (*pvVar8 - local_2a8[local_2b4]));
                pvVar4 = std::
                         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       *)in_stack_fffffffffffffb18,(long)local_29c);
                pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (pvVar4,(long)local_2b8);
                local_328 = (double)in_stack_fffffffffffffb20 * (*pvVar8 - local_2a8[local_2b8]);
                dVar10 = (local_2e8 + local_308 + local_328) * local_2b0;
                std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::
                operator[]((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                           local_30,(long)local_29c);
                SymmetricMatrix::operator[]
                          ((SymmetricMatrix *)in_stack_fffffffffffffaa8._M_current,
                           (int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
                pdVar7 = SymmetricMatrix::Row::operator[]
                                   ((Row *)in_stack_fffffffffffffaa0,
                                    (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
                *pdVar7 = dVar10;
                SymmetricMatrix::Row::~Row(&local_340);
              }
            }
          }
        }
      }
      else {
        for (local_238 = 0; local_238 < *(int *)((long)in_RDI + 0xc); local_238 = local_238 + 1) {
          pvVar6 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)local_28,(long)local_238);
          local_240 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,0);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_59 + 1),
                              (long)local_238);
          local_248 = 1.0 / *pvVar5;
          for (local_24c = 0; local_24c <= *(int *)(in_RDI + 1); local_24c = local_24c + 1) {
            if (((ulong)in_RDI[0x15] & 1) == 0) {
              local_43c = 0;
            }
            else {
              local_43c = local_24c;
            }
            for (local_250 = local_43c; local_250 <= local_24c; local_250 = local_250 + 1) {
              SymmetricMatrix::operator[]
                        ((SymmetricMatrix *)in_stack_fffffffffffffaa8._M_current,
                         (int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
              pdVar7 = SymmetricMatrix::Row::operator[]
                                 ((Row *)in_stack_fffffffffffffaa0,
                                  (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
              dVar10 = *pdVar7;
              SymmetricMatrix::Row::~Row(&local_268);
              if ((dVar10 != 0.0) || (NAN(dVar10))) {
                std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::
                operator[](&local_a8,(long)local_238);
                SymmetricMatrix::operator[]
                          ((SymmetricMatrix *)in_stack_fffffffffffffaa8._M_current,
                           (int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
                pdVar7 = SymmetricMatrix::Row::operator[]
                                   ((Row *)in_stack_fffffffffffffaa0,
                                    (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
                dVar10 = local_240[local_24c];
                dVar11 = local_240[local_250];
                dVar12 = *pdVar7 * local_248;
                std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::
                operator[]((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                           local_30,(long)local_238);
                SymmetricMatrix::operator[]
                          ((SymmetricMatrix *)in_stack_fffffffffffffaa8._M_current,
                           (int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
                pdVar7 = SymmetricMatrix::Row::operator[]
                                   ((Row *)in_stack_fffffffffffffaa0,
                                    (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
                *pdVar7 = dVar12 - dVar10 * dVar11;
                SymmetricMatrix::Row::~Row(&local_298);
                SymmetricMatrix::Row::~Row(&local_280);
              }
            }
          }
        }
      }
      FloorVariance(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
      *local_38 = (double)local_188.data_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start;
      local_188.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((double)local_188.data_.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start /
                    (double)(int)local_188._12_4_);
      dVar10 = (double)local_188.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start - (double)local_130;
      if (local_134 % *(int *)((long)in_RDI + 0x54) == 0) {
        poVar9 = std::operator<<((ostream *)&std::cerr,"iter ");
        in_stack_fffffffffffffcb4 = std::setw(3);
        poVar9 = std::operator<<(poVar9,in_stack_fffffffffffffcb4);
        in_stack_fffffffffffffae0 =
             (GaussianMixtureModeling *)std::ostream::operator<<(poVar9,local_134);
        std::operator<<((ostream *)in_stack_fffffffffffffae0," : ");
        in_stack_fffffffffffffad8 = std::operator<<((ostream *)&std::cerr,"average = ");
        std::ostream::operator<<
                  (in_stack_fffffffffffffad8,
                   (double)local_188.data_.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start);
        if (local_134 == 1) {
          std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
        }
        else {
          poVar9 = std::operator<<((ostream *)&std::cerr,", change = ");
          this_00 = (void *)std::ostream::operator<<(poVar9,dVar10);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        }
      }
      if (dVar10 < in_RDI[3]) break;
      local_130 = local_188.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    local_1 = 1;
LAB_0010a80c:
    local_18c = 1;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0._M_current);
    Buffer::~Buffer(in_stack_fffffffffffffaa0);
    std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector
              ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
               in_stack_fffffffffffffab0._M_current);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)in_stack_fffffffffffffab0._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0._M_current);
  }
LAB_0010a892:
  return (bool)(local_1 & 1);
}

Assistant:

bool GaussianMixtureModeling::Run(
    const std::vector<std::vector<double> >& input_vectors,
    std::vector<double>* weights,
    std::vector<std::vector<double> >* mean_vectors,
    std::vector<SymmetricMatrix>* covariance_matrices,
    double* total_log_likelihood) const {
  // Check inputs.
  if (!is_valid_ || input_vectors.empty() || NULL == weights ||
      NULL == mean_vectors || NULL == covariance_matrices ||
      NULL == total_log_likelihood) {
    return false;
  }

  // Initialize GMM parameters.
  const int length(num_order_ + 1);
  switch (initialization_type_) {
    case kNone: {
      if (!CheckGmm(num_mixture_, length, *weights, *mean_vectors,
                    *covariance_matrices)) {
        return false;
      }
      break;
    }
    case kKMeans: {
      if (!Initialize(input_vectors, weights, mean_vectors,
                      covariance_matrices)) {
        return false;
      }
      break;
    }
    case kUbm: {
      *weights = ubm_weights_;
      *mean_vectors = ubm_mean_vectors_;
      *covariance_matrices = ubm_covariance_matrices_;
      break;
    }
    default: {
      return false;
    }
  }

  // Prepare memories.
  std::vector<double> buffer0(num_mixture_);
  std::vector<std::vector<double> > buffer1(num_mixture_);
  for (int k(0); k < num_mixture_; ++k) {
    buffer1[k].resize(length);
  }
  std::vector<SymmetricMatrix> buffer2(num_mixture_);
  for (int k(0); k < num_mixture_; ++k) {
    buffer2[k].Resize(length);
  }
  GaussianMixtureModeling::Buffer buffer;
  std::vector<double> numerators(num_mixture_);

  double prev_log_likelihood(sptk::kMin);

  for (int n(1); n <= num_iteration_; ++n) {
    // Clear buffers.
    std::fill(buffer0.begin(), buffer0.end(), 0.0);
    for (int k(0); k < num_mixture_; ++k) {
      std::fill(buffer1[k].begin(), buffer1[k].end(), 0.0);
      buffer2[k].Fill(0.0);
    }
    buffer.precomputed_ = false;

    // Perform E-step.
    double log_likelihood(0.0);
    const int num_data(static_cast<int>(input_vectors.size()));
    for (int t(0); t < num_data; ++t) {
      // Compute log-likelihood of data.
      double denominator;
      if (!CalculateLogProbability(num_order_, num_mixture_, is_diagonal_,
                                   false, input_vectors[t], *weights,
                                   *mean_vectors, *covariance_matrices,
                                   &numerators, &denominator, &buffer)) {
        return false;
      }
      log_likelihood += denominator;

      const double* x(&(input_vectors[t][0]));
      for (int k(0); k < num_mixture_; ++k) {
        const double posterior(std::exp(numerators[k] - denominator));

        // Accumulate zeroth-order statistics.
        buffer0[k] += posterior;

        // Accumulate first-order statistics.
        for (int l(0); l <= num_order_; ++l) {
          buffer1[k][l] += posterior * x[l];
        }

        // Accumulate second-order statistics.
        for (int l(0); l <= num_order_; ++l) {
          for (int m(is_diagonal_ ? l : 0); m <= l; ++m) {
            if (0.0 != mask_[l][m]) {
              buffer2[k][l][m] += posterior * x[l] * x[m];
            }
          }
        }
      }
    }

    // Update mixture weights.
    if (0.0 == smoothing_parameter_) {
      const double z(1.0 / num_data);
      for (int k(0); k < num_mixture_; ++k) {
        (*weights)[k] = buffer0[k] * z;
      }
    } else {
      const double z(1.0 / (num_data + smoothing_parameter_));
      for (int k(0); k < num_mixture_; ++k) {
        (*weights)[k] = (buffer0[k] + xi_[k]) * z;
      }
    }
    FloorWeight(weights);

    // Update mean vectors.
    if (0.0 == smoothing_parameter_) {
      for (int k(0); k < num_mixture_; ++k) {
        double* mu(&((*mean_vectors)[k][0]));
        const double z(1.0 / buffer0[k]);
        for (int l(0); l <= num_order_; ++l) {
          mu[l] = buffer1[k][l] * z;
        }
      }
    } else {
      for (int k(0); k < num_mixture_; ++k) {
        double* mu(&((*mean_vectors)[k][0]));
        const double z(1.0 / (buffer0[k] + xi_[k]));
        for (int l(0); l <= num_order_; ++l) {
          mu[l] = (buffer1[k][l] + xi_[k] * ubm_mean_vectors_[k][l]) * z;
        }
      }
    }

    // Update covariance matrices.
    if (0.0 == smoothing_parameter_) {
      for (int k(0); k < num_mixture_; ++k) {
        const double* mu(&((*mean_vectors)[k][0]));
        const double z(1.0 / buffer0[k]);
        for (int l(0); l <= num_order_; ++l) {
          for (int m(is_diagonal_ ? l : 0); m <= l; ++m) {
            if (0.0 != mask_[l][m]) {
              (*covariance_matrices)[k][l][m] =
                  buffer2[k][l][m] * z - (mu[l] * mu[m]);
            }
          }
        }
      }
    } else {
      for (int k(0); k < num_mixture_; ++k) {
        const double* mu(&((*mean_vectors)[k][0]));
        const double z(1.0 / (buffer0[k] + xi_[k]));
        for (int l(0); l <= num_order_; ++l) {
          for (int m(is_diagonal_ ? l : 0); m <= l; ++m) {
            if (0.0 != mask_[l][m]) {
              const double mu_l(buffer1[k][l] / buffer0[k]);
              const double mu_m(buffer1[k][m] / buffer0[k]);
              const double a(buffer2[k][l][m] -
                             buffer0[k] *
                                 (mu_l * mu[m] + mu[l] * mu_m - mu[l] * mu[m]));
              const double b(xi_[k] * ubm_covariance_matrices_[k][l][m]);
              const double c(xi_[k] * (ubm_mean_vectors_[k][l] - mu[l]) *
                             (ubm_mean_vectors_[k][m] - mu[m]));
              (*covariance_matrices)[k][l][m] = (a + b + c) * z;
            }
          }
        }
      }
    }
    FloorVariance(covariance_matrices);

    // Check convergence.
    *total_log_likelihood = log_likelihood;
    log_likelihood /= num_data;
    const double change(log_likelihood - prev_log_likelihood);
    if (0 == n % log_interval_) {
      std::cerr << "iter " << std::setw(3) << n << " : ";
      std::cerr << "average = " << log_likelihood;
      if (1 == n) {
        std::cerr << std::endl;
      } else {
        std::cerr << ", change = " << change << std::endl;
      }
    }
    if (change < convergence_threshold_) {
      break;
    }
    prev_log_likelihood = log_likelihood;
  }

  return true;
}